

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix22<float> __thiscall Imath_3_2::Matrix22<float>::inverse(Matrix22<float> *this)

{
  float afVar1 [2];
  float *pfVar2;
  int i;
  long lVar3;
  float *in_RSI;
  long lVar4;
  float fVar5;
  float afVar6 [2];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  Matrix22<float> MVar12;
  float local_10;
  float fStack_c;
  float fStack_8;
  float local_4;
  
  local_10 = in_RSI[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(in_RSI + 1);
  afVar6 = DAT_00153290._0_8_;
  fStack_c = SUB164(auVar9 ^ _DAT_00153290,0);
  fStack_8 = SUB164(auVar9 ^ _DAT_00153290,4);
  local_4 = *in_RSI;
  fVar5 = *in_RSI * in_RSI[3] + fStack_8 * (float)*(ulong *)(in_RSI + 1);
  fVar8 = (float)((uint)fVar5 ^ (uint)DAT_00153290);
  fVar7 = fVar5;
  if (fVar5 <= fVar8) {
    fVar7 = fVar8;
  }
  if (1.0 <= fVar7) {
    pfVar2 = &local_10;
    auVar9 = _DAT_00153290;
    for (lVar3 = 0; afVar6 = auVar9._0_8_, lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        auVar9 = ZEXT416((uint)(pfVar2[lVar4] / fVar5));
        pfVar2[lVar4] = pfVar2[lVar4] / fVar5;
      }
      pfVar2 = pfVar2 + 2;
    }
  }
  else {
    pfVar2 = &local_10;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        fVar8 = pfVar2[lVar4];
        fVar10 = (float)((uint)fVar8 ^ (uint)DAT_00153290);
        fVar11 = fVar8;
        if (fVar8 <= fVar10) {
          fVar11 = fVar10;
        }
        if (fVar7 * 8.507059e+37 <= fVar11) {
          this->x[0] = (float  [2])0x3f800000;
          this->x[1][0] = 0.0;
          local_4 = 1.0;
          goto LAB_00137cf6;
        }
        pfVar2[lVar4] = fVar8 / fVar5;
      }
      pfVar2 = pfVar2 + 2;
    }
  }
  afVar1[1] = fStack_c;
  afVar1[0] = local_10;
  this->x[0] = afVar1;
  this->x[1][0] = fStack_8;
LAB_00137cf6:
  MVar12.x[0][1] = 0.0;
  MVar12.x[0][0] = local_4;
  this->x[1][1] = local_4;
  MVar12.x[1][0] = afVar6[0];
  MVar12.x[1][1] = afVar6[1];
  return (Matrix22<float>)MVar12.x;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix22<T>
                 Matrix22<T>::inverse () const IMATH_NOEXCEPT
{
    Matrix22 s (x[1][1], -x[0][1], -x[1][0], x[0][0]);

    T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 2; ++i)
        {
            for (int j = 0; j < 2; ++j)
            {
                s[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 2; ++i)
        {
            for (int j = 0; j < 2; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s[i][j]))
                {
                    s[i][j] /= r;
                }
                else
                {
                    return Matrix22 ();
                }
            }
        }
    }
    return s;
}